

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_flattened_io_block_member
          (CompilerGLSL *this,string *basename,SPIRType *type,char *qual,
          SmallVector<unsigned_int,_8UL> *indices)

{
  uint32_t id;
  uint index;
  uint *puVar1;
  SPIRType *pSVar2;
  SPIRType *type_00;
  string *psVar3;
  long lVar4;
  uint32_t id_00;
  string flattened_name;
  string backup_name;
  string member_name;
  allocator local_c9;
  char *local_c8;
  SmallVector<unsigned_int,_8UL> *local_c0;
  long local_b8;
  string local_b0;
  string local_90;
  string local_70 [32];
  string local_50;
  
  id_00 = (type->super_IVariant).self.id;
  local_c8 = qual;
  ::std::__cxx11::string::string((string *)&local_b0,(string *)basename);
  puVar1 = (indices->super_VectorView<unsigned_int>).ptr;
  local_b8 = (indices->super_VectorView<unsigned_int>).buffer_size << 2;
  type_00 = (SPIRType *)0x0;
  local_c0 = indices;
  for (lVar4 = 0; local_b8 != lVar4; lVar4 = lVar4 + 4) {
    ::std::__cxx11::string::append((char *)&local_b0);
    to_member_name_abi_cxx11_(&local_90,this,type,*(uint32_t *)((long)puVar1 + lVar4));
    ::std::__cxx11::string::append((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_90);
    id_00 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
            [*(uint *)((long)puVar1 + lVar4)].id;
    pSVar2 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id_00);
    type_00 = type;
    type = pSVar2;
  }
  if (*(int *)&(type->super_IVariant).field_0xc != 0xf) {
    id = (type_00->type_alias).id;
    if (id != 0) {
      type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
    }
    ParsedIR::sanitize_underscores(&local_b0);
    index = (local_c0->super_VectorView<unsigned_int>).ptr
            [(local_c0->super_VectorView<unsigned_int>).buffer_size - 1];
    psVar3 = Compiler::get_member_name_abi_cxx11_
                       (&this->super_Compiler,(TypeID)(type_00->super_IVariant).self.id,index);
    ::std::__cxx11::string::string((string *)&local_90,(string *)psVar3);
    to_member_name_abi_cxx11_(&local_50,this,type_00,index);
    Compiler::set_member_name
              (&this->super_Compiler,(TypeID)(type_00->super_IVariant).self.id,index,&local_b0);
    ::std::__cxx11::string::string(local_70,local_c8,&local_c9);
    (*(this->super_Compiler)._vptr_Compiler[0x15])
              (this,type_00,(ulong)id_00,(ulong)index,local_70,0);
    ::std::__cxx11::string::~string(local_70);
    Compiler::set_member_name
              (&this->super_Compiler,(TypeID)(type_00->super_IVariant).self.id,index,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_b0);
    return;
  }
  __assert_fail("member_type->basetype != SPIRType::Struct",
                "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                ,0xa05,
                "void spirv_cross::CompilerGLSL::emit_flattened_io_block_member(const std::string &, const SPIRType &, const char *, const SmallVector<uint32_t> &)"
               );
}

Assistant:

void CompilerGLSL::emit_flattened_io_block_member(const std::string &basename, const SPIRType &type, const char *qual,
                                                  const SmallVector<uint32_t> &indices)
{
	uint32_t member_type_id = type.self;
	const SPIRType *member_type = &type;
	const SPIRType *parent_type = nullptr;
	auto flattened_name = basename;
	for (auto &index : indices)
	{
		flattened_name += "_";
		flattened_name += to_member_name(*member_type, index);
		parent_type = member_type;
		member_type_id = member_type->member_types[index];
		member_type = &get<SPIRType>(member_type_id);
	}

	assert(member_type->basetype != SPIRType::Struct);

	// We're overriding struct member names, so ensure we do so on the primary type.
	if (parent_type->type_alias)
		parent_type = &get<SPIRType>(parent_type->type_alias);

	// Sanitize underscores because joining the two identifiers might create more than 1 underscore in a row,
	// which is not allowed.
	ParsedIR::sanitize_underscores(flattened_name);

	uint32_t last_index = indices.back();

	// Pass in the varying qualifier here so it will appear in the correct declaration order.
	// Replace member name while emitting it so it encodes both struct name and member name.
	auto backup_name = get_member_name(parent_type->self, last_index);
	auto member_name = to_member_name(*parent_type, last_index);
	set_member_name(parent_type->self, last_index, flattened_name);
	emit_struct_member(*parent_type, member_type_id, last_index, qual);
	// Restore member name.
	set_member_name(parent_type->self, last_index, member_name);
}